

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

MethodHandle * __thiscall
jsonrpccxx::methodHandle<std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<std::vector<Product,_std::allocator<Product>_>_()> *method)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function
            ((function<std::vector<Product,_std::allocator<Product>_>_()> *)&local_30,
             (function<std::vector<Product,_std::allocator<Product>_>_()> *)this);
  createMethodHandle<std::vector<Product,_std::allocator<Product>_>_>
            (__return_storage_ptr__,&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }